

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackRPMGenerator::PackageOnePack
          (cmCPackRPMGenerator *this,string *initialToplevel,string *packageName)

{
  cmCPackLog *this_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  undefined4 extraout_var;
  ostream *this_01;
  char *msg;
  string local_3b0 [32];
  undefined1 local_390 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_211;
  string local_210;
  char local_1e9;
  undefined1 local_1e8 [8];
  string component_path;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  allocator<char> local_129;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  string local_e0;
  cmValue local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string outputFileName;
  undefined1 local_68 [8];
  string packageFileName;
  string localToplevel;
  int retval;
  string *packageName_local;
  string *initialToplevel_local;
  cmCPackRPMGenerator *this_local;
  
  std::__cxx11::string::string
            ((string *)(packageFileName.field_2._M_local_buf + 8),(string *)initialToplevel);
  cmsys::SystemTools::GetParentDirectory
            ((string *)local_68,&(this->super_cmCPackGenerator).toplevel);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"CPACK_PACKAGE_FILE_NAME",&local_e1);
  local_c0 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_e0);
  psVar3 = cmValue::operator_cast_to_string_(&local_c0);
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[8])(&local_b8,this,psVar3,packageName,1);
  iVar2 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_b8,(char *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::operator+(&local_108,"/",packageName);
  std::__cxx11::string::operator+=
            ((string *)(packageFileName.field_2._M_local_buf + 8),(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"CPACK_TEMPORARY_DIRECTORY",&local_129);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,&local_128,(string *)((long)&packageFileName.field_2 + 8)
            );
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::operator+(&local_150,"/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::__cxx11::string::operator+=((string *)local_68,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"CPACK_OUTPUT_FILE_NAME",&local_171);
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_170,(string *)local_98);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",&local_199);
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_198,(string *)local_68);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"CPACK_RPM_PACKAGE_COMPONENT",
             (allocator<char> *)(component_path.field_2._M_local_buf + 0xf));
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_1c0,packageName);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)(component_path.field_2._M_local_buf + 0xf));
  local_1e9 = '/';
  cmStrCat<char,std::__cxx11::string_const&>((string *)local_1e8,&local_1e9,packageName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"CPACK_RPM_PACKAGE_COMPONENT_PART_PATH",&local_211);
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_210,(string *)local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  bVar1 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackRPM.cmake");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_390);
    this_01 = std::operator<<((ostream *)local_390,"Error while execution CPackRPM.cmake");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                    ,0x5a,msg);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_390);
  }
  localToplevel.field_2._13_3_ = 0;
  localToplevel.field_2._M_local_buf[0xc] = bVar1;
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(packageFileName.field_2._M_local_buf + 8));
  return localToplevel.field_2._12_4_;
}

Assistant:

int cmCPackRPMGenerator::PackageOnePack(std::string const& initialToplevel,
                                        std::string const& packageName)
{
  int retval = 1;
  // Begin the archive for this pack
  std::string localToplevel(initialToplevel);
  std::string packageFileName(
    cmSystemTools::GetParentDirectory(this->toplevel));
  std::string outputFileName(
    this->GetComponentPackageFileName(
      this->GetOption("CPACK_PACKAGE_FILE_NAME"), packageName, true) +
    this->GetOutputExtension());

  localToplevel += "/" + packageName;
  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel);
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName);
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME", packageFileName);
  // Tell CPackRPM.cmake the name of the component NAME.
  this->SetOption("CPACK_RPM_PACKAGE_COMPONENT", packageName);
  // Tell CPackRPM.cmake the path where the component is.
  std::string component_path = cmStrCat('/', packageName);
  this->SetOption("CPACK_RPM_PACKAGE_COMPONENT_PART_PATH", component_path);
  if (!this->ReadListFile("Internal/CPack/CPackRPM.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackRPM.cmake" << std::endl);
    retval = 0;
  }

  return retval;
}